

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registration.c
# Opt level: O2

void registration_func(worker_handle *wh)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  char *pcVar6;
  char *__s;
  char *__s_00;
  char *__s_01;
  uint uVar7;
  uint uVar8;
  int iVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  uint8_t *buff;
  conn_handle conn;
  uint8_t local_158 [296];
  
  plVar1 = (long *)wh->func_ctx;
  lVar2 = *plVar1;
  mutex_lock((mutex_handle *)(lVar2 + 0x20));
  lVar3 = *(long *)(lVar2 + 0x48);
  uVar4 = *(undefined8 *)(lVar2 + 0x50);
  uVar7 = *(uint *)(lVar2 + 0x58);
  mutex_unlock((mutex_handle *)(lVar2 + 0x20));
  if ((ulong)uVar7 != 0) {
    puVar5 = (undefined8 *)*plVar1;
    pcVar6 = status_phrase[uVar7];
    conn.priv = (void *)0x0;
    conn.source_addr = (char *)0x0;
    conn.source_port = (char *)0x0;
    conn.type = CONN_TYPE_TCP;
    conn._28_4_ = 0;
    __s = (char *)*puVar5;
    sVar10 = strlen(__s);
    __s_00 = (char *)puVar5[1];
    sVar11 = strlen(__s_00);
    __s_01 = (char *)puVar5[2];
    sVar12 = strlen(__s_01);
    buff = (uint8_t *)malloc(sVar12 + sVar11 + sVar10 + 0x50);
    if (buff != (uint8_t *)0x0) {
      if (lVar3 == 1) {
        uVar7 = sprintf((char *)buff,"name=%s&comment=%s&public=%c&status=%s%s",__s,__s_00,
                        (ulong)(uint)(int)*(char *)(puVar5 + 3),pcVar6,__s_01);
      }
      else {
        uVar7 = sprintf((char *)buff,"name=%s&comment=%s [%lu/%lu]&public=%c&status=%s%s",__s,__s_00
                        ,uVar4,lVar3,(ulong)(uint)(int)*(char *)(puVar5 + 3),pcVar6,__s_01);
      }
      if (0 < (int)uVar7) {
        uVar8 = sprintf((char *)local_158,"%s%d\r\n\r\n",
                        "POST /proxypost.jsp HTTP/1.1\r\nContent-Type: application/x-www-form-urlencoded\r\nCache-Control: no-cache\r\nPragma: no-cache\r\nUser-Agent: OpenELP/0.9.4-dev\r\nHost: www.echolink.org\r\nAccept: text/html, image/gif, image/jpeg, *; q=.2, */*; q=.2\r\nConnection: keep-alive\r\nContent-Length: "
                        ,(ulong)uVar7);
        if (0 < (int)uVar8) {
          conn._24_8_ = conn._24_8_ & 0xffffffff00000000;
          iVar9 = conn_init(&conn);
          if (-1 < iVar9) {
            iVar9 = conn_connect(&conn,"www.echolink.org","80");
            if (-1 < iVar9) {
              iVar9 = conn_send(&conn,local_158,(ulong)uVar8);
              if (-1 < iVar9) {
                iVar9 = conn_send(&conn,buff,(ulong)uVar7);
                if (-1 < iVar9) {
                  conn_recv(&conn,buff,0xd);
                }
              }
            }
          }
        }
      }
      conn_free(&conn);
      free(buff);
    }
  }
  return;
}

Assistant:

static void registration_func(struct worker_handle *wh)
{
	struct registration_service_handle *rs = wh->func_ctx;
	struct registration_service_priv *priv = rs->priv;

	int ret;
	size_t slots_total;
	size_t slots_used;
	enum REGISTRATION_STATUS status;

	mutex_lock(&priv->mutex);

	slots_total = priv->slots_total;
	slots_used = priv->slots_used;
	status = priv->status;

	mutex_unlock(&priv->mutex);

	if (status <= REGISTRATION_STATUS_UNKNOWN)
		return;

	ret = send_report(rs, status, slots_used, slots_total);
	if (ret < 0) {
		/* printf("Proxy registration failed (%d): %s\n",
		 *	  -ret, strerror(-ret));
		 */
	}
}